

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::
FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)'\x00'>::dump
          (FixedHeaderType<(Protocol::MQTT::Common::ControlPacketType)3,_(unsigned_char)__x00_>
           *this,FastString *out,int indent)

{
  byte bVar1;
  undefined4 in_register_00000014;
  String local_20;
  
  bVar1 = (this->super_FixedHeaderBase).typeAndFlags;
  MQTTStringPrintf((char *)&local_20,"%*sHeader: (type PUBLISH, retain %d, QoS %d, dup %d)\n",
                   CONCAT44(in_register_00000014,indent),"",(ulong)(bVar1 & 1),
                   (ulong)(bVar1 >> 1 & 3),bVar1 >> 3 & 1);
  Bstrlib::String::operator+=(out,&local_20);
  Bstrlib::String::~String(&local_20);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0) { out += MQTTStringPrintf("%*sHeader: (type PUBLISH, retain %d, QoS %d, dup %d)\n", (int)indent, "", isRetain(), getQoS(), isDup()); }